

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall testing::internal::UnitTestImpl::failed_test_count(UnitTestImpl *this)

{
  int iVar1;
  UnitTestImpl *this_local;
  
  iVar1 = SumOverTestSuiteList
                    ((internal *)&this->test_suites_,
                     (vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                     TestSuite::failed_test_count,0);
  return iVar1;
}

Assistant:

int UnitTestImpl::failed_test_count() const {
  return SumOverTestSuiteList(test_suites_, &TestSuite::failed_test_count);
}